

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O1

char * google::protobuf::internal::FieldParser<google::protobuf::internal::UnknownFieldParserHelper>
                 (uint64 tag,UnknownFieldParserHelper *field_parser,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  byte bVar2;
  LogMessage *other;
  char *pcVar3;
  uint32 res32;
  uint32 num;
  pair<const_char_*,_unsigned_long> pVar4;
  LogMessage local_60;
  LogFinisher local_21;
  
  num = (uint32)(tag >> 3);
  if (num == 0) {
    return (char *)0x0;
  }
  switch((uint)tag & 7) {
  case 0:
    bVar1 = *ptr;
    pVar4.second = (long)(char)bVar1;
    pVar4.first = ptr + 1;
    if ((long)(char)bVar1 < 0) {
      bVar2 = ptr[1];
      res32 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar4 = VarintParseSlow64(ptr,res32);
      }
      else {
        pVar4.second._0_4_ = res32;
        pVar4.first = ptr + 2;
        pVar4.second._4_4_ = 0;
      }
    }
    if (pVar4.first == (char *)0x0) {
      return (char *)0x0;
    }
    UnknownFieldSet::AddVarint(field_parser->unknown_,num,pVar4.second);
    return pVar4.first;
  case 1:
    UnknownFieldSet::AddFixed64(field_parser->unknown_,num,*(uint64 *)ptr);
    return ptr + 8;
  case 2:
    pcVar3 = UnknownFieldParserHelper::ParseLengthDelimited(field_parser,num,ptr,ctx);
    break;
  case 3:
    pcVar3 = UnknownFieldParserHelper::ParseGroup(field_parser,num,ptr,ctx);
    break;
  case 4:
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/parse_context.h"
               ,0x2b6);
    other = LogMessage::operator<<(&local_60,"Can\'t happen");
    LogFinisher::operator=(&local_21,other);
    LogMessage::~LogMessage(&local_60);
    return ptr;
  case 5:
    UnknownFieldSet::AddFixed32(field_parser->unknown_,num,*(uint32 *)ptr);
    return ptr + 4;
  default:
    goto LAB_00308b8a;
  }
  if (pcVar3 != (char *)0x0) {
    return pcVar3;
  }
LAB_00308b8a:
  return (char *)0x0;
}

Assistant:

PROTOBUF_MUST_USE_RESULT const char* FieldParser(uint64 tag, T& field_parser,
                                                 const char* ptr,
                                                 ParseContext* ctx) {
  uint32 number = tag >> 3;
  GOOGLE_PROTOBUF_PARSER_ASSERT(number != 0);
  using WireType = internal::WireFormatLite::WireType;
  switch (tag & 7) {
    case WireType::WIRETYPE_VARINT: {
      uint64 value;
      ptr = VarintParse(ptr, &value);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      field_parser.AddVarint(number, value);
      break;
    }
    case WireType::WIRETYPE_FIXED64: {
      uint64 value = UnalignedLoad<uint64>(ptr);
      ptr += 8;
      field_parser.AddFixed64(number, value);
      break;
    }
    case WireType::WIRETYPE_LENGTH_DELIMITED: {
      ptr = field_parser.ParseLengthDelimited(number, ptr, ctx);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      break;
    }
    case WireType::WIRETYPE_START_GROUP: {
      ptr = field_parser.ParseGroup(number, ptr, ctx);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      break;
    }
    case WireType::WIRETYPE_END_GROUP: {
      GOOGLE_LOG(FATAL) << "Can't happen";
      break;
    }
    case WireType::WIRETYPE_FIXED32: {
      uint32 value = UnalignedLoad<uint32>(ptr);
      ptr += 4;
      field_parser.AddFixed32(number, value);
      break;
    }
    default:
      return nullptr;
  }
  return ptr;
}